

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
quaternion_costruction_from_components::test_method(quaternion_costruction_from_components *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  void *extraout_RDX;
  char *pcVar4;
  undefined4 local_1fc;
  double local_1f8;
  basic_cstring<const_char> local_1f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1e0;
  basic_cstring<const_char> local_1b8;
  basic_cstring<const_char> local_1a8;
  undefined8 local_198;
  undefined1 local_190 [8];
  basic_cstring<const_char> local_188;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_178;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140;
  undefined8 local_130;
  double local_128;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_110;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  undefined8 local_c8;
  double local_c0 [3];
  basic_cstring<const_char> local_a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_98;
  basic_cstring<const_char> local_70;
  basic_cstring<const_char> local_60;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined1 local_30 [8];
  Quaternion<double> test;
  quaternion_costruction_from_components *this_local;
  
  local_38 = 0.1;
  local_40 = 0.5;
  local_48 = 0.9;
  local_50 = 1.0;
  test.nk = (double)this;
  Quaternion<double>::Quaternion
            ((Quaternion<double> *)local_30,&local_38,&local_40,&local_48,&local_50);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_60,0x3e,&local_70);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_98,plVar3,(char (*) [1])0x122152);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
               ,0x67);
    local_c0[0] = Quaternion<double>::a((Quaternion<double> *)local_30);
    local_c8 = 0x3fb999999999999a;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (&local_98,&local_a8,0x3e,1,2,local_c0,"test.a()",&local_c8,"0.1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x3f,&local_e8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_110,plVar3,(char (*) [1])0x122152);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
               ,0x67);
    local_128 = Quaternion<double>::b((Quaternion<double> *)local_30);
    local_130 = 0x3fe0000000000000;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (&local_110,&local_120,0x3f,1,2,&local_128,"test.b()",&local_130,"0.5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_110);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_150);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_140,0x40,&local_150);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_178,plVar3,(char (*) [1])0x122152);
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
               ,0x67);
    Quaternion<double>::c((Quaternion<double> *)local_30,pcVar4,extraout_RDX);
    local_198 = 0x3feccccccccccccd;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (&local_178,&local_188,0x40,1,2,local_190,"test.c()",&local_198,"0.9");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_178);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
               ,0x67);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a8,0x41,&local_1b8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1e0,plVar3,(char (*) [1])0x122152);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Andreabont[P]simple-template-quaternion/test.cpp"
               ,0x67);
    local_1f8 = Quaternion<double>::d((Quaternion<double> *)local_30);
    local_1fc = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,int>
              (&local_1e0,&local_1f0,0x41,1,2,&local_1f8,"test.d()",&local_1fc,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_costruction_from_components) {
    Quaternion<double> test(0.1,0.5,0.9,1);
    BOOST_CHECK_EQUAL(test.a(), 0.1);
    BOOST_CHECK_EQUAL(test.b(), 0.5);
    BOOST_CHECK_EQUAL(test.c(), 0.9);
    BOOST_CHECK_EQUAL(test.d(), 1);
}